

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimeinfo.cpp
# Opt level: O2

void __thiscall hbm::streaming::deltaTimeInfo::setDelta(deltaTimeInfo *this,Value *params)

{
  bool bVar1;
  uint uVar2;
  UInt UVar3;
  UInt UVar4;
  UInt UVar5;
  Value *pVVar6;
  Value *pVVar7;
  ulong uVar8;
  ostream *poVar9;
  runtime_error *this_00;
  ulong uVar10;
  Value value;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(&value,nullValue);
  pVVar6 = Json::Value::operator[](params,"samples");
  Json::Value::Value(&local_58,pVVar6);
  Json::Value::operator=(&value,&local_58);
  Json::Value::~Value(&local_58);
  bVar1 = Json::Value::isNull(&value);
  if (bVar1) {
    uVar2 = 1;
  }
  else {
    uVar2 = Json::Value::asUInt(&value);
    if (uVar2 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"samples must be > 0");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pVVar6 = Json::Value::operator[](params,"delta");
  pVVar7 = Json::Value::operator[](pVVar6,"type");
  Json::Value::Value(&local_80,"ntp");
  bVar1 = Json::Value::operator==(pVVar7,&local_80);
  Json::Value::~Value(&local_80);
  if (bVar1) {
    pVVar7 = Json::Value::operator[](pVVar6,"seconds");
    Json::Value::Value(&local_a8,pVVar7);
    Json::Value::operator=(&value,&local_a8);
    Json::Value::~Value(&local_a8);
    bVar1 = Json::Value::isNull(&value);
    UVar3 = 0;
    if (!bVar1) {
      UVar3 = Json::Value::asUInt(&value);
    }
    pVVar7 = Json::Value::operator[](pVVar6,"fraction");
    Json::Value::Value(&local_d0,pVVar7);
    Json::Value::operator=(&value,&local_d0);
    Json::Value::~Value(&local_d0);
    bVar1 = Json::Value::isNull(&value);
    UVar4 = 0;
    if (!bVar1) {
      UVar4 = Json::Value::asUInt(&value);
    }
    pVVar6 = Json::Value::operator[](pVVar6,"subFraction");
    Json::Value::Value(&local_f8,pVVar6);
    Json::Value::operator=(&value,&local_f8);
    Json::Value::~Value(&local_f8);
    bVar1 = Json::Value::isNull(&value);
    if (bVar1) {
      UVar5 = 0;
    }
    else {
      UVar5 = Json::Value::asUInt(&value);
    }
  }
  else {
    UVar5 = 0;
    UVar4 = 0;
    UVar3 = 0;
  }
  uVar10 = (ulong)uVar2;
  uVar8 = CONCAT44(UVar3,UVar4) / uVar10;
  this->m_deltaNtpTimestamp = uVar8;
  this->m_deltaSubFraction =
       ((uVar8 % uVar10 << 0x20) / uVar10 & 0xffffffff) + (ulong)UVar5 / (ulong)uVar2;
  poVar9 = std::operator<<((ostream *)&std::cout,"setDelta");
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"seconds = ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = std::operator<<(poVar9," (0x");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9,")");
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"fraction = ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = std::operator<<(poVar9," (0x");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9,")");
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar9);
  poVar9 = std::operator<<((ostream *)&std::cout,"subFraction = ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar9 = std::operator<<(poVar9," (0x");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9,")");
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar9);
  Json::Value::~Value(&value);
  return;
}

Assistant:

void deltaTimeInfo::setDelta(const Json::Value& params)
		{
			uint32_t samples = 1;
			uint32_t seconds = 0;
			uint32_t fraction = 0;
			uint32_t subFraction = 0;

			Json::Value value;

			value = params["samples"];
			if(value.isNull()==false) {
				samples = value.asUInt();
				if(samples==0) {
					throw std::runtime_error("samples must be > 0");
				}
			}

			const Json::Value& timeObject = params["delta"];
			if(timeObject["type"]=="ntp") {
				value = timeObject["seconds"];
				if(value.isNull()==false) {
					seconds = value.asUInt();
				}

				value = timeObject["fraction"];
				if(value.isNull()==false) {
					fraction = value.asUInt();
				}

				value = timeObject["subFraction"];
				if(value.isNull()==false) {
					subFraction = value.asUInt();
				}
			}
			uint64_t ntpTimestamp = seconds;
			ntpTimestamp <<= 32;
			ntpTimestamp |= fraction;



			// we are loosing precision here. In order to compensate this, we calculate a correction to use.
			m_deltaNtpTimestamp = ntpTimestamp/samples;
			m_deltaSubFraction = subFraction/samples;

			// determine remainder and calculate sub fraction from it.
			uint64_t remainder = m_deltaNtpTimestamp%samples;
			remainder <<= 32;
			remainder /= samples;
			m_deltaSubFraction += static_cast < uint32_t > (remainder & 0xffffffff);

			std::cout << __FUNCTION__ << std::endl;
			std::cout << "seconds = " << seconds << std::hex << " (0x" << seconds << ")" << std::dec << std::endl;
			std::cout << "fraction = " << fraction << std::hex << " (0x" << fraction << ")" << std::dec << std::endl;
			std::cout << "subFraction = " << subFraction << std::hex << " (0x" << subFraction << ")" << std::dec << std::endl;
		}